

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

int32_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
::do_run_mode(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
              *this,int32_t index,encoder_strategy *param_2)

{
  triplet<unsigned_char> *ptVar1;
  anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 aVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  pixel_type *ppVar9;
  pixel_type *ppVar10;
  bool bVar11;
  triplet<unsigned_char> tVar12;
  triplet<unsigned_char> rb;
  int iVar13;
  triplet<unsigned_char> *ptVar14;
  triplet<unsigned_char> x;
  uint uVar15;
  uint run_length;
  ulong uVar16;
  ulong uVar17;
  
  uVar15 = this->width_ - index;
  ppVar9 = this->current_line_;
  ptVar1 = ppVar9 + index;
  ppVar10 = this->previous_line_;
  uVar3 = ppVar9[(long)index + -1].field_0;
  uVar6 = ppVar9[(long)index + -1].field_1;
  aVar2 = (anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5)ppVar9[(long)index + -1].field_2.v3;
  tVar12.field_2 =
       (anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5)
       (anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5)aVar2.v3;
  tVar12.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar3;
  tVar12.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar6;
  uVar16 = 0;
  ptVar14 = ptVar1;
  do {
    bVar11 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::is_near
                       (&this->traits_,*ptVar14,tVar12);
    uVar17 = uVar16;
    if (!bVar11) break;
    ptVar14->field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar3;
    ptVar14->field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar6;
    (ptVar14->field_2).v3 = (uchar)aVar2;
    uVar16 = uVar16 + 1;
    ptVar14 = ptVar14 + 1;
    uVar17 = (ulong)uVar15;
  } while (uVar15 != uVar16);
  run_length = (uint)uVar17;
  encode_run_pixels(this,run_length,run_length == uVar15);
  if (run_length != uVar15) {
    uVar4 = ptVar1[(int)run_length].field_0;
    uVar7 = ptVar1[(int)run_length].field_1;
    x.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar7;
    x.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar4;
    x.field_2.v3 = ptVar1[(int)run_length].field_2.v3;
    ppVar9 = ppVar10 + (long)index + (long)(int)run_length;
    uVar5 = ppVar9->field_0;
    uVar8 = ppVar9->field_1;
    rb.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar8;
    rb.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar5;
    rb.field_2.v3 = ppVar10[(long)index + (long)(int)run_length].field_2.v3;
    tVar12 = encode_run_interruption_pixel(this,x,tVar12,rb);
    ptVar1[(int)run_length].field_0 =
         (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)(char)tVar12._0_2_;
    ptVar1[(int)run_length].field_1 =
         (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)(char)((ushort)tVar12._0_2_ >> 8);
    ptVar1[(int)run_length].field_2.v3 = (uchar)tVar12.field_2;
    iVar13 = 1;
    if (1 < this->run_index_) {
      iVar13 = this->run_index_;
    }
    this->run_index_ = iVar13 + -1;
    run_length = run_length + 1;
  }
  return run_length;
}

Assistant:

int32_t do_run_mode(const int32_t index, encoder_strategy* /*strategy*/)
    {
        const int32_t count_type_remain = width_ - index;
        pixel_type* type_cur_x{current_line_ + index};
        const pixel_type* type_prev_x{previous_line_ + index};

        const pixel_type ra{type_cur_x[-1]};

        int32_t run_length{};
        while (traits_.is_near(type_cur_x[run_length], ra))
        {
            type_cur_x[run_length] = ra;
            ++run_length;

            if (run_length == count_type_remain)
                break;
        }

        encode_run_pixels(run_length, run_length == count_type_remain);

        if (run_length == count_type_remain)
            return run_length;

        type_cur_x[run_length] = encode_run_interruption_pixel(type_cur_x[run_length], ra, type_prev_x[run_length]);
        decrement_run_index();
        return run_length + 1;
    }